

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

size_t mbuf_insert(mbuf *a,size_t off,void *buf,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  
  if (a == (mbuf *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                  ,0x583,"size_t mbuf_insert(struct mbuf *, size_t, const void *, size_t)");
  }
  uVar3 = a->len;
  if (a->size < uVar3) {
    __assert_fail("a->len <= a->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                  ,0x584,"size_t mbuf_insert(struct mbuf *, size_t, const void *, size_t)");
  }
  if (uVar3 < off) {
    __assert_fail("off <= a->len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CryptXor[P]jetservd/mongoose.c"
                  ,0x585,"size_t mbuf_insert(struct mbuf *, size_t, const void *, size_t)");
  }
  pcVar1 = a->buf;
  if (!CARRY8((ulong)pcVar1,len)) {
    uVar2 = uVar3 + len;
    if (uVar2 <= a->size) {
      memmove(pcVar1 + off + len,pcVar1 + off,uVar3 - off);
      if (buf != (void *)0x0) {
        memcpy(a->buf + off,buf,len);
      }
      a->len = a->len + len;
      return len;
    }
    auVar5._8_4_ = (int)(uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar7 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.5;
    uVar3 = (ulong)dVar7;
    pcVar1 = (char *)realloc(pcVar1,(long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f |
                                    uVar3);
    if (pcVar1 != (char *)0x0) {
      a->buf = pcVar1;
      pcVar1 = pcVar1 + off;
      sVar4 = a->len;
      memmove(pcVar1 + len,pcVar1,sVar4 - off);
      if (buf != (void *)0x0) {
        memcpy(pcVar1,buf,len);
      }
      sVar4 = sVar4 + len;
      auVar6._8_4_ = (int)(sVar4 >> 0x20);
      auVar6._0_8_ = sVar4;
      auVar6._12_4_ = 0x45300000;
      dVar7 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 1.5;
      a->len = sVar4;
      uVar3 = (ulong)dVar7;
      a->size = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
      return len;
    }
  }
  return 0;
}

Assistant:

size_t mbuf_insert(struct mbuf *a, size_t off, const void *buf, size_t len) {
    char *p = NULL;

    assert(a != NULL);
    assert(a->len <= a->size);
    assert(off <= a->len);

    /* check overflow */
    if (~(size_t) 0 - (size_t) a->buf < len) return 0;

    if (a->len + len <= a->size) {
        memmove(a->buf + off + len, a->buf + off, a->len - off);
        if (buf != NULL) {
            memcpy(a->buf + off, buf, len);
        }
        a->len += len;
    } else if ((p = (char *) MBUF_REALLOC(
            a->buf, (a->len + len) * MBUF_SIZE_MULTIPLIER)) != NULL) {
        a->buf = p;
        memmove(a->buf + off + len, a->buf + off, a->len - off);
        if (buf != NULL) {
            memcpy(a->buf + off, buf, len);
        }
        a->len += len;
        a->size = a->len * MBUF_SIZE_MULTIPLIER;
    } else {
        len = 0;
    }

    return len;
}